

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Promise<void> __thiscall
kj::anon_unknown_36::NetworkHttpClient::handleCleanup
          (NetworkHttpClient *this,
          map<kj::StringPtr,_kj::(anonymous_namespace)::NetworkHttpClient::Host,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::NetworkHttpClient::Host>_>_>
          *hosts,iterator iter)

{
  pointer ppVar1;
  Promise<void> local_30;
  _Base_ptr local_28;
  map<kj::StringPtr,_kj::(anonymous_namespace)::NetworkHttpClient::Host,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::NetworkHttpClient::Host>_>_>
  *hosts_local;
  NetworkHttpClient *this_local;
  iterator iter_local;
  
  local_28 = iter._M_node;
  hosts_local = hosts;
  iter_local._M_node = (_Base_ptr)this;
  ppVar1 = std::
           _Rb_tree_iterator<std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::NetworkHttpClient::Host>_>
           ::operator->((_Rb_tree_iterator<std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::NetworkHttpClient::Host>_>
                         *)&this_local);
  Own<kj::(anonymous_namespace)::PromiseNetworkAddressHttpClient,_std::nullptr_t>::operator->
            (&(ppVar1->second).client);
  PromiseNetworkAddressHttpClient::onDrained((PromiseNetworkAddressHttpClient *)&local_30);
  Promise<void>::
  then<kj::(anonymous_namespace)::NetworkHttpClient::handleCleanup(std::map<kj::StringPtr,kj::(anonymous_namespace)::NetworkHttpClient::Host,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,kj::(anonymous_namespace)::NetworkHttpClient::Host>>>&,std::_Rb_tree_iterator<std::pair<kj::StringPtr_const,kj::(anonymous_namespace)::NetworkHttpClient::Host>>)::_lambda()_1_>
            ((Promise<void> *)this,(Type *)&local_30);
  Promise<void>::~Promise(&local_30);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> handleCleanup(std::map<kj::StringPtr, Host>& hosts,
                                  std::map<kj::StringPtr, Host>::iterator iter) {
    return iter->second.client->onDrained()
        .then([this,&hosts,iter]() -> kj::Promise<void> {
      // Double-check that it's really drained to avoid race conditions.
      if (iter->second.client->isDrained()) {
        hosts.erase(iter);
        return kj::READY_NOW;
      } else {
        return handleCleanup(hosts, iter);
      }
    });
  }